

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int * get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  vrna_fc_type_e vVar1;
  vrna_param_t *pvVar2;
  int *piVar3;
  int *piVar4;
  code *pcVar5;
  code *pcVar6;
  uchar uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  undefined4 in_register_00000034;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  uint local_bc;
  char *local_90;
  char *local_78;
  
  lVar11 = (long)j;
  piVar12 = (int *)vrna_alloc(j * 4);
  pvVar2 = fc->params;
  piVar3 = fc->jindx;
  vVar1 = fc->type;
  if (vVar1 == VRNA_FC_TYPE_SINGLE) {
    local_90 = (fc->field_23).field_0.ptype;
  }
  else {
    local_90 = (char *)0x0;
  }
  uVar10 = (pvVar2->model_details).min_loop_size;
  iVar20 = piVar3[lVar11];
  if (vVar1 == VRNA_FC_TYPE_SINGLE) {
    local_bc = 1;
  }
  else {
    local_bc = (fc->field_23).field_1.n_seq;
  }
  uVar17 = ~uVar10;
  if (vVar1 == VRNA_FC_TYPE_SINGLE) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = (fc->field_23).field_0.ptype_pf_compat;
  }
  piVar4 = (fc->matrices->field_2).field_0.c;
  iVar14 = j + iVar20 + uVar17;
  pcVar5 = (code *)sc_wrapper->red_stem;
  pcVar6 = (code *)sc_wrapper->decomp_stem;
  if (vVar1 == VRNA_FC_TYPE_COMPARATIVE) {
    if (1 < (int)(j + uVar17)) {
      uVar21 = (ulong)(j + uVar17);
      lVar15 = (long)iVar14;
      do {
        piVar12[uVar21] = 10000000;
        iVar20 = (int)uVar21;
        if (((piVar4[lVar15] != 10000000) &&
            (uVar7 = (*evaluate)(1,j,iVar20 + -1,iVar20,'\x12',hc_dat_local), uVar7 != '\0')) &&
           (piVar12[uVar21] = piVar4[lVar15], local_bc != 0)) {
          uVar19 = 0;
          do {
            uVar13 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_78 + uVar19 * 8) + uVar21 * 2
                                                      ),
                                       (int)*(short *)(*(long *)(local_78 + uVar19 * 8) + lVar11 * 2
                                                      ),&pvVar2->model_details);
            iVar14 = 0;
            if (2 < uVar13) {
              iVar14 = pvVar2->TerminalAU;
            }
            piVar12[uVar21] = piVar12[uVar21] + iVar14;
            uVar19 = uVar19 + 1;
          } while (local_bc != uVar19);
        }
        uVar21 = uVar21 - 1;
        lVar15 = lVar15 + -1;
      } while (2 < iVar20);
    }
  }
  else if ((vVar1 == VRNA_FC_TYPE_SINGLE) && (uVar13 = j + uVar17, 1 < (int)uVar13)) {
    iVar20 = ~uVar10 + iVar20;
    iVar16 = -uVar10;
    iVar22 = -2 - uVar10;
    lVar15 = 0;
    uVar18 = uVar17;
    do {
      piVar12[(ulong)uVar13 + lVar15] = 10000000;
      if ((piVar4[iVar14 + lVar15] != 10000000) &&
         (uVar7 = (*evaluate)(1,j,j + iVar22,j + uVar18,'\x12',hc_dat_local), uVar7 != '\0')) {
        piVar12[(ulong)uVar13 + lVar15] = piVar4[iVar14 + lVar15];
        uVar8 = vrna_get_ptype(j + iVar20,local_90);
        iVar9 = 0;
        if (2 < uVar8) {
          iVar9 = pvVar2->TerminalAU;
        }
        piVar12[(ulong)uVar13 + lVar15] = piVar12[(ulong)uVar13 + lVar15] + iVar9;
      }
      lVar15 = lVar15 + -1;
      iVar20 = iVar20 + -1;
      iVar9 = j + iVar16;
      iVar16 = iVar16 + -1;
      uVar18 = uVar18 - 1;
      iVar22 = iVar22 + -1;
    } while (2 < iVar9 + -1);
  }
  if ((pcVar6 != (code *)0x0) && (1 < (int)(uVar17 + j))) {
    uVar21 = (ulong)(uVar17 + j);
    iVar20 = j - uVar10;
    do {
      if (piVar12[uVar21] != 10000000) {
        iVar14 = (*pcVar6)(CONCAT44(in_register_00000034,j),iVar20 + -2,uVar21 & 0xffffffff,
                           sc_wrapper);
        piVar12[uVar21] = piVar12[uVar21] + iVar14;
      }
      uVar21 = uVar21 - 1;
      iVar20 = iVar20 + -1;
    } while (2 < iVar20);
  }
  piVar12[1] = 10000000;
  iVar20 = piVar3[lVar11];
  if ((piVar4[(long)iVar20 + 1] != 10000000) &&
     (uVar7 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar7 != '\0')) {
    piVar12[1] = piVar4[(long)iVar20 + 1];
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      uVar10 = vrna_get_ptype(iVar20 + 1,local_90);
      iVar20 = 0;
      if (2 < uVar10) {
        iVar20 = pvVar2->TerminalAU;
      }
      piVar12[1] = piVar12[1] + iVar20;
    }
    else if ((fc->type == VRNA_FC_TYPE_COMPARATIVE) && (local_bc != 0)) {
      uVar21 = 0;
      do {
        uVar10 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_78 + uVar21 * 8) + 2),
                                   (int)*(short *)(*(long *)(local_78 + uVar21 * 8) + lVar11 * 2),
                                   &pvVar2->model_details);
        iVar20 = 0;
        if (2 < uVar10) {
          iVar20 = pvVar2->TerminalAU;
        }
        piVar12[1] = piVar12[1] + iVar20;
        uVar21 = uVar21 + 1;
      } while (local_bc != uVar21);
    }
    if (pcVar5 != (code *)0x0) {
      iVar20 = (*pcVar5)(CONCAT44(in_register_00000034,j),1,j,sc_wrapper);
      piVar12[1] = piVar12[1] + iVar20;
    }
  }
  return piVar12;
}

Assistant:

int *
get_stem_contributions_d0(vrna_fold_compound_t      *fc,
                          int                       j,
                          vrna_callback_hc_evaluate *evaluate,
                          struct default_data       *hc_dat_local,
                          struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   **S;
  unsigned int            s, n_seq, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn - 1;
  ptype = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype : NULL;
  n_seq = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S     = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;

        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i]  = c[ij];
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];

          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(S[s][i], S[s][j], md);
            stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
          }
        }
      }
      break;
  }

  if (sc_spl_stem)
    for (i = j - turn - 1; i > 1; i--)
      if (stems[i] != INF)
        stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

  stems[1]  = INF;
  ij        = indx[j] + 1;

  if ((c[ij] != INF) &&
      (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
    stems[1] = c[ij];

    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(S[s][1], S[s][j], md);
          stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        }
        break;
    }

    if (sc_red_stem)
      stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
  }

  return stems;
}